

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGP4.cc
# Opt level: O3

Eci * libsgp4::SGP4::CalculateFinalPositionVelocity
                (Eci *__return_storage_ptr__,DateTime *dt,double e,double a,double omega,double xl,
                double xnode,double xinc,double xlcof,double aycof,double x3thm1,double x1mth2,
                double x7thm1,double cosio,double sinio)

{
  DecayedException *this;
  uint uVar1;
  pointer_____offset_0x10___ *ppuVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  undefined1 local_58 [16];
  double local_48;
  double local_40;
  Vector local_38;
  
  dVar9 = kXKE;
  dVar3 = pow(a,1.5);
  dVar4 = cos(omega);
  dVar4 = dVar4 * e;
  dVar15 = 1.0 / ((1.0 - e * e) * a);
  dVar5 = sin(omega);
  dVar5 = dVar5 * e + aycof * dVar15;
  dVar11 = dVar4 * dVar4 + dVar5 * dVar5;
  if (1.0 <= dVar11) {
    this = (DecayedException *)__cxa_allocate_exception(0x10);
    SatelliteException::SatelliteException((SatelliteException *)this,"Error: (elsq >= 1.0)");
  }
  else {
    dVar6 = fmod((dVar15 * xlcof * dVar4 + xl) - xnode,6.283185307179586);
    dVar15 = ABS(SQRT(dVar11)) * 1.25;
    uVar1 = 0;
    dVar20 = dVar6;
    do {
      dVar7 = sin(dVar20);
      dVar8 = cos(dVar20);
      dVar18 = kXKE;
      dVar16 = dVar4 * dVar8 + dVar5 * dVar7;
      dVar17 = dVar4 * dVar7 + dVar8 * -dVar5;
      dVar12 = (dVar6 - dVar20) + dVar17;
      if (ABS(dVar12) < 1e-12) break;
      dVar14 = 1.0 - dVar16;
      dVar13 = dVar12 / dVar14;
      if (uVar1 == 0) {
        dVar14 = dVar15;
        if ((dVar13 <= dVar15) && (dVar14 = dVar13, dVar13 < -dVar15)) {
          dVar14 = -dVar15;
        }
      }
      else {
        dVar14 = dVar12 / (dVar17 * 0.5 * dVar13 + dVar14);
      }
      if (8 < uVar1) break;
      dVar20 = dVar20 + dVar14;
      uVar1 = uVar1 + 1;
    } while (1e-12 <= ABS(dVar12));
    dVar11 = 1.0 - dVar11;
    dVar15 = dVar11 * a;
    if (0.0 <= dVar15) {
      dVar20 = (1.0 - dVar16) * a;
      if (a < 0.0) {
        dVar6 = sqrt(a);
      }
      else {
        dVar6 = SQRT(a);
      }
      dVar12 = kXKE;
      dVar16 = 1.0 / dVar20;
      if (dVar15 < 0.0) {
        dVar13 = sqrt(dVar15);
      }
      else {
        dVar13 = SQRT(dVar15);
      }
      if (dVar11 < 0.0) {
        dVar11 = sqrt(dVar11);
      }
      else {
        dVar11 = SQRT(dVar11);
      }
      dVar14 = 1.0 / (dVar11 + 1.0);
      dVar8 = a * dVar16 * (dVar14 * dVar17 * dVar5 + (dVar8 - dVar4));
      dVar4 = a * dVar16 * (dVar14 * dVar17 * -dVar4 + (dVar7 - dVar5));
      dVar5 = atan2(dVar4,dVar8);
      dVar19 = (dVar4 + dVar4) * dVar8;
      dVar4 = (1.0 / dVar15) * 0.000541308;
      dVar15 = (1.0 / dVar15) * dVar4;
      dVar14 = dVar15 * 1.5;
      dVar7 = (dVar8 + dVar8) * dVar8 + -1.0;
      dVar8 = dVar20 * (1.0 - dVar11 * dVar14 * x3thm1) + dVar4 * 0.5 * x1mth2 * dVar7;
      dVar5 = dVar5 + dVar15 * -0.25 * x7thm1 * dVar19;
      dVar14 = dVar14 * cosio;
      dVar15 = dVar14 * dVar19 + xnode;
      dVar11 = dVar14 * sinio * dVar7 + xinc;
      dVar4 = (dVar9 / dVar3) * dVar4;
      dVar20 = dVar18 * dVar6 * dVar17 * dVar16 - dVar4 * x1mth2 * dVar19;
      dVar6 = (dVar7 * x1mth2 + x3thm1 * 1.5) * dVar4 + dVar12 * dVar13 * dVar16;
      dVar9 = sin(dVar5);
      dVar3 = cos(dVar5);
      dVar4 = sin(dVar11);
      dVar5 = cos(dVar11);
      dVar11 = sin(dVar15);
      dVar15 = cos(dVar15);
      local_38.z = dVar9 * dVar4 * dVar8 * 6378.135;
      local_38.w = 0.0;
      dVar18 = dVar9 * -dVar11 * dVar5 + dVar15 * dVar3;
      dVar7 = dVar9 * dVar15 * dVar5 + dVar11 * dVar3;
      local_38.x = dVar8 * dVar18 * 6378.135;
      local_38.y = dVar8 * dVar7 * 6378.135;
      auVar10._0_8_ =
           (dVar20 * dVar18 + dVar6 * (-dVar11 * dVar5 * dVar3 - dVar9 * dVar15)) * 6378.135;
      auVar10._8_8_ =
           (dVar20 * dVar7 + dVar6 * (dVar15 * dVar5 * dVar3 - dVar9 * dVar11)) * 6378.135;
      local_58 = divpd(auVar10,_DAT_0010ac70);
      local_48 = ((dVar9 * dVar4 * dVar20 + dVar4 * dVar3 * dVar6) * 6378.135) / 60.0;
      local_40 = 0.0;
      if (1.0 <= dVar8) {
        (__return_storage_ptr__->m_dt).m_encoded = dt->m_encoded;
        (__return_storage_ptr__->m_position).x = local_38.x;
        (__return_storage_ptr__->m_position).y = local_38.y;
        (__return_storage_ptr__->m_position).z = local_38.z;
        (__return_storage_ptr__->m_position).w = 0.0;
        (__return_storage_ptr__->m_velocity).x = (double)local_58._0_8_;
        (__return_storage_ptr__->m_velocity).y = (double)local_58._8_8_;
        (__return_storage_ptr__->m_velocity).z = local_48;
        (__return_storage_ptr__->m_velocity).w = 0.0;
        return __return_storage_ptr__;
      }
      this = (DecayedException *)__cxa_allocate_exception(0x58);
      DecayedException::DecayedException(this,dt,&local_38,(Vector *)local_58);
      ppuVar2 = &DecayedException::typeinfo;
      goto LAB_001085d2;
    }
    this = (DecayedException *)__cxa_allocate_exception(0x10);
    SatelliteException::SatelliteException((SatelliteException *)this,"Error: (pl < 0.0)");
  }
  ppuVar2 = &SatelliteException::typeinfo;
LAB_001085d2:
  __cxa_throw(this,ppuVar2,std::runtime_error::~runtime_error);
}

Assistant:

Eci SGP4::CalculateFinalPositionVelocity(
        const DateTime& dt,
        const double e,
        const double a,
        const double omega,
        const double xl,
        const double xnode,
        const double xinc,
        const double xlcof,
        const double aycof,
        const double x3thm1,
        const double x1mth2,
        const double x7thm1,
        const double cosio,
        const double sinio)
{
    const double beta2 = 1.0 - e * e;
    const double xn = kXKE / pow(a, 1.5);
    /*
     * long period periodics
     */
    const double axn = e * cos(omega);
    const double temp11 = 1.0 / (a * beta2);
    const double xll = temp11 * xlcof * axn;
    const double aynl = temp11 * aycof;
    const double xlt = xl + xll;
    const double ayn = e * sin(omega) + aynl;
    const double elsq = axn * axn + ayn * ayn;

    if (elsq >= 1.0)
    {
        throw SatelliteException("Error: (elsq >= 1.0)");
    }

    /*
     * solve keplers equation
     * - solve using Newton-Raphson root solving
     * - here capu is almost the mean anomoly
     * - initialise the eccentric anomaly term epw
     * - The fmod saves reduction of angle to +/-2pi in sin/cos() and prevents
     * convergence problems.
     */
    const double capu = fmod(xlt - xnode, kTWOPI);
    double epw = capu;

    double sinepw = 0.0;
    double cosepw = 0.0;
    double ecose = 0.0;
    double esine = 0.0;

    /*
     * sensibility check for N-R correction
     */
    const double max_newton_naphson = 1.25 * fabs(sqrt(elsq));

    bool kepler_running = true;

    for (int i = 0; i < 10 && kepler_running; i++)
    {
        sinepw = sin(epw);
        cosepw = cos(epw);
        ecose = axn * cosepw + ayn * sinepw;
        esine = axn * sinepw - ayn * cosepw;

        double f = capu - epw + esine;

        if (fabs(f) < 1.0e-12)
        {
            kepler_running = false;
        }
        else
        {
            /*
             * 1st order Newton-Raphson correction
             */
            const double fdot = 1.0 - ecose;
            double delta_epw = f / fdot;

            /*
             * 2nd order Newton-Raphson correction.
             * f / (fdot - 0.5 * d2f * f/fdot)
             */
            if (i == 0)
            {
                if (delta_epw > max_newton_naphson)
                {
                    delta_epw = max_newton_naphson;
                }
                else if (delta_epw < -max_newton_naphson)
                {
                    delta_epw = -max_newton_naphson;
                }
            }
            else
            {
                delta_epw = f / (fdot + 0.5 * esine * delta_epw);
            }

            /*
             * Newton-Raphson correction of -F/DF
             */
            epw += delta_epw;
        }
    }
    /*
     * short period preliminary quantities
     */
    const double temp21 = 1.0 - elsq;
    const double pl = a * temp21;

    if (pl < 0.0)
    {
        throw SatelliteException("Error: (pl < 0.0)");
    }

    const double r = a * (1.0 - ecose);
    const double temp31 = 1.0 / r;
    const double rdot = kXKE * sqrt(a) * esine * temp31;
    const double rfdot = kXKE * sqrt(pl) * temp31;
    const double temp32 = a * temp31;
    const double betal = sqrt(temp21);
    const double temp33 = 1.0 / (1.0 + betal);
    const double cosu = temp32 * (cosepw - axn + ayn * esine * temp33);
    const double sinu = temp32 * (sinepw - ayn - axn * esine * temp33);
    const double u = atan2(sinu, cosu);
    const double sin2u = 2.0 * sinu * cosu;
    const double cos2u = 2.0 * cosu * cosu - 1.0;

    /*
     * update for short periodics
     */
    const double temp41 = 1.0 / pl;
    const double temp42 = kCK2 * temp41;
    const double temp43 = temp42 * temp41;

    const double rk = r * (1.0 - 1.5 * temp43 * betal * x3thm1)
        + 0.5 * temp42 * x1mth2 * cos2u;
    const double uk = u - 0.25 * temp43 * x7thm1 * sin2u;
    const double xnodek = xnode + 1.5 * temp43 * cosio * sin2u;
    const double xinck = xinc + 1.5 * temp43 * cosio * sinio * cos2u;
    const double rdotk = rdot - xn * temp42 * x1mth2 * sin2u;
    const double rfdotk = rfdot + xn * temp42 * (x1mth2 * cos2u + 1.5 * x3thm1);

    /*
     * orientation vectors
     */
    const double sinuk = sin(uk);
    const double cosuk = cos(uk);
    const double sinik = sin(xinck);
    const double cosik = cos(xinck);
    const double sinnok = sin(xnodek);
    const double cosnok = cos(xnodek);
    const double xmx = -sinnok * cosik;
    const double xmy = cosnok * cosik;
    const double ux = xmx * sinuk + cosnok * cosuk;
    const double uy = xmy * sinuk + sinnok * cosuk;
    const double uz = sinik * sinuk;
    const double vx = xmx * cosuk - cosnok * sinuk;
    const double vy = xmy * cosuk - sinnok * sinuk;
    const double vz = sinik * cosuk;
    /*
     * position and velocity
     */
    const double x = rk * ux * kXKMPER;
    const double y = rk * uy * kXKMPER;
    const double z = rk * uz * kXKMPER;
    Vector position(x, y, z);
    const double xdot = (rdotk * ux + rfdotk * vx) * kXKMPER / 60.0;
    const double ydot = (rdotk * uy + rfdotk * vy) * kXKMPER / 60.0;
    const double zdot = (rdotk * uz + rfdotk * vz) * kXKMPER / 60.0;
    Vector velocity(xdot, ydot, zdot);

    if (rk < 1.0)
    {
        throw DecayedException(
                dt,
                position,
                velocity);
    }

    return Eci(dt, position, velocity);
}